

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2projections.cc
# Opt level: O0

R2Point __thiscall S2::Projection::WrapDestination(Projection *this,R2Point *a,R2Point *b)

{
  double dVar1;
  double dVar2;
  double dVar3;
  R2Point RVar4;
  double local_50;
  double y;
  double x;
  R2Point wrap;
  R2Point *b_local;
  R2Point *a_local;
  Projection *this_local;
  VType local_10;
  
  wrap.c_[1] = (VType)b;
  (*this->_vptr_Projection[7])();
  y = Vector2<double>::x((Vector2<double> *)wrap.c_[1]);
  local_50 = Vector2<double>::y((Vector2<double> *)wrap.c_[1]);
  dVar1 = Vector2<double>::x((Vector2<double> *)&x);
  if (0.0 < dVar1) {
    dVar1 = Vector2<double>::x(a);
    dVar2 = Vector2<double>::x((Vector2<double> *)&x);
    if (dVar2 * 0.5 < ABS(y - dVar1)) {
      dVar1 = Vector2<double>::x(a);
      dVar2 = Vector2<double>::x(a);
      dVar3 = Vector2<double>::x((Vector2<double> *)&x);
      dVar2 = remainder(y - dVar2,dVar3);
      y = dVar1 + dVar2;
    }
  }
  dVar1 = Vector2<double>::y((Vector2<double> *)&x);
  if (0.0 < dVar1) {
    dVar1 = Vector2<double>::y(a);
    dVar2 = Vector2<double>::y((Vector2<double> *)&x);
    if (dVar2 * 0.5 < ABS(local_50 - dVar1)) {
      dVar1 = Vector2<double>::y(a);
      dVar2 = Vector2<double>::y(a);
      dVar3 = Vector2<double>::y((Vector2<double> *)&x);
      local_50 = remainder(local_50 - dVar2,dVar3);
      local_50 = dVar1 + local_50;
    }
  }
  Vector2<double>::Vector2((Vector2<double> *)&this_local,y,local_50);
  RVar4.c_[0] = (VType)this_local;
  RVar4.c_[1] = local_10;
  return (R2Point)RVar4.c_;
}

Assistant:

R2Point Projection::WrapDestination(const R2Point& a, const R2Point& b) const {
  R2Point wrap = wrap_distance();
  double x = b.x(), y = b.y();
  // The code below ensures that "b" is unmodified unless wrapping is required.
  if (wrap.x() > 0 && fabs(x - a.x()) > 0.5 * wrap.x()) {
    x = a.x() + remainder(x - a.x(), wrap.x());
  }
  if (wrap.y() > 0 && fabs(y - a.y()) > 0.5 * wrap.y()) {
    y = a.y() + remainder(y - a.y(), wrap.y());
  }
  return R2Point(x, y);
}